

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

void __thiscall METADemuxer::readClose(METADemuxer *this)

{
  pointer pSVar1;
  StreamInfo *codecInfo;
  pointer __pos;
  
  __pos = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
          super__Vector_impl_data._M_start;
  pSVar1 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__pos != pSVar1) {
    do {
      (*__pos->m_dataReader->_vptr_AbstractReader[7])
                (__pos->m_dataReader,(ulong)(uint)__pos->m_readerID);
      if (__pos->m_streamReader != (AbstractStreamReader *)0x0) {
        (*(__pos->m_streamReader->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[1])
                  ();
      }
      __pos = __pos + 1;
    } while (__pos != pSVar1);
    __pos = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  }
  std::vector<StreamInfo,_std::allocator<StreamInfo>_>::_M_erase_at_end(&this->m_codecInfo,__pos);
  return;
}

Assistant:

void METADemuxer::readClose()
{
    for (const auto& codecInfo : m_codecInfo)
    {
        codecInfo.m_dataReader->deleteReader(codecInfo.m_readerID);
        delete codecInfo.m_streamReader;
    }
    m_codecInfo.clear();
}